

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfont.cpp
# Opt level: O0

QStringList * splitIntoFamilies(QString *family)

{
  bool bVar1;
  int iVar2;
  qsizetype qVar3;
  QStringView *in_RSI;
  QStringView *in_RDI;
  long in_FS_OFFSET;
  int i;
  int numFamilies;
  QStringList *familyList;
  QStringView str;
  QList<QStringView> list;
  QStringView *this;
  undefined4 in_stack_ffffffffffffff68;
  int iVar4;
  undefined4 in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  uint3 in_stack_ffffffffffffff74;
  uint uVar5;
  QStringView *n;
  QList<QString> *in_stack_ffffffffffffff88;
  QChar local_50;
  QChar local_4e;
  QChar local_4c;
  QChar local_4a;
  QStringView local_48;
  undefined6 in_stack_ffffffffffffffc8;
  QChar in_stack_ffffffffffffffce;
  undefined1 local_30 [16];
  QList<QStringView> local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = (uint)in_stack_ffffffffffffff74;
  ((DataPointer *)&in_RDI->m_size)->d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  in_RDI->m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
  in_RDI[1].m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  this = in_RDI;
  n = in_RDI;
  QList<QString>::QList((QList<QString> *)0x711678);
  bVar1 = QString::isEmpty((QString *)0x711682);
  if (bVar1) {
    uVar5 = 0x1000000;
  }
  else {
    local_20.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_20.d.ptr = (QStringView *)&DAT_aaaaaaaaaaaaaaaa;
    local_20.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QStringView::QStringView<QString,_true>
              ((QStringView *)CONCAT44(uVar5,in_stack_ffffffffffffff70),
               (QString *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    QChar::QChar<char16_t,_true>((QChar *)&stack0xffffffffffffffce,L',');
    QFlags<Qt::SplitBehaviorFlags>::QFlags
              ((QFlags<Qt::SplitBehaviorFlags> *)this,(SplitBehaviorFlags)((ulong)in_RDI >> 0x20));
    QStringView::split((QChar)(char16_t)&local_20,(QFlags_conflict *)local_30,
                       (uint)(ushort)in_stack_ffffffffffffffce.ucs);
    qVar3 = QList<QStringView>::size(&local_20);
    iVar2 = (int)qVar3;
    QList<QString>::reserve
              (in_stack_ffffffffffffff88,
               CONCAT26(in_stack_ffffffffffffffce.ucs,in_stack_ffffffffffffffc8));
    for (iVar4 = 0; iVar4 < iVar2; iVar4 = iVar4 + 1) {
      local_48.m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
      local_48.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      QList<QStringView>::at((QList<QStringView> *)this,(qsizetype)in_RDI);
      local_48 = QStringView::trimmed((QStringView *)CONCAT44(iVar2,iVar4));
      QChar::QChar<char16_t,_true>(&local_4a,L'\"');
      bVar1 = QStringView::startsWith
                        ((QStringView *)CONCAT44(uVar5,in_stack_ffffffffffffff70),
                         (QChar)(char16_t)((ulong)in_RSI >> 0x30));
      if (bVar1) {
        QChar::QChar<char16_t,_true>(&local_4c,L'\"');
        bVar1 = QStringView::endsWith
                          ((QStringView *)CONCAT44(uVar5,in_stack_ffffffffffffff70),
                           (QChar)(char16_t)((ulong)in_RSI >> 0x30));
        if (!bVar1) goto LAB_007117cc;
LAB_00711814:
        QStringView::size(&local_48);
        local_48 = QStringView::mid(in_RSI,(qsizetype)in_stack_ffffffffffffff88,(qsizetype)n);
      }
      else {
LAB_007117cc:
        QChar::QChar<char16_t,_true>(&local_4e,L'\'');
        bVar1 = QStringView::startsWith
                          ((QStringView *)CONCAT44(uVar5,in_stack_ffffffffffffff70),
                           (QChar)(char16_t)((ulong)in_RSI >> 0x30));
        if (bVar1) {
          QChar::QChar<char16_t,_true>(&local_50,L'\'');
          bVar1 = QStringView::endsWith
                            ((QStringView *)CONCAT44(uVar5,in_stack_ffffffffffffff70),
                             (QChar)(char16_t)((ulong)in_RSI >> 0x30));
          if (bVar1) goto LAB_00711814;
        }
      }
      QStringView::toString(this);
      QList<QString>::operator<<((QList<QString> *)this,(rvalue_ref)in_RDI);
      QString::~QString((QString *)0x711879);
    }
    uVar5 = 0x1000000;
    QList<QStringView>::~QList((QList<QStringView> *)0x7118a3);
  }
  if ((uVar5 & 0x1000000) == 0) {
    QList<QString>::~QList((QList<QString> *)0x7118b3);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QStringList *)this;
}

Assistant:

static QStringList splitIntoFamilies(const QString &family)
{
    QStringList familyList;
    if (family.isEmpty())
        return familyList;
    const auto list = QStringView{family}.split(u',');
    const int numFamilies = list.size();
    familyList.reserve(numFamilies);
    for (int i = 0; i < numFamilies; ++i) {
        auto str = list.at(i).trimmed();
        if ((str.startsWith(u'"') && str.endsWith(u'"'))
            || (str.startsWith(u'\'') && str.endsWith(u'\''))) {
            str = str.mid(1, str.size() - 2);
        }
        familyList << str.toString();
    }
    return familyList;
}